

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cpp
# Opt level: O0

void patch_CheckAssertions(Assertion *assert)

{
  PatchType PVar1;
  Assertion *pAVar2;
  int32_t iVar3;
  char *pcVar4;
  char *local_68;
  char *local_50;
  char *local_38;
  Assertion *next;
  AssertionType type;
  int32_t value;
  Assertion *assert_local;
  
  if (beVerbose) {
    fprintf(_stderr,"Checking assertions...\n");
  }
  initRPNStack();
  _type = assert;
  do {
    if (_type == (Assertion *)0x0) {
      freeRPNStack();
      return;
    }
    iVar3 = computeRPNExpr(&_type->patch,_type->fileSymbols);
    PVar1 = (_type->patch).type;
    if (((isError & 1U) == 0) && (iVar3 == 0)) {
      if (PVar1 == PATCHTYPE_BYTE) {
        if (*_type->message == '\0') {
          local_68 = "assert failure";
        }
        else {
          local_68 = _type->message;
        }
        warning((_type->patch).src,(_type->patch).lineNo,"%s",local_68);
      }
      else if (PVar1 == PATCHTYPE_WORD) {
        if (*_type->message == '\0') {
          local_50 = "assert failure";
        }
        else {
          local_50 = _type->message;
        }
        error((_type->patch).src,(_type->patch).lineNo,"%s",local_50);
      }
      else if (PVar1 == PATCHTYPE_LONG) {
        if (*_type->message == '\0') {
          local_38 = "assert failure";
        }
        else {
          local_38 = _type->message;
        }
        fatal((_type->patch).src,(_type->patch).lineNo,"%s",local_38);
      }
    }
    else if (((isError & 1U) != 0) && (PVar1 == PATCHTYPE_LONG)) {
      pcVar4 = "";
      if (*_type->message != '\0') {
        pcVar4 = ": ";
      }
      fatal((_type->patch).src,(_type->patch).lineNo,"couldn\'t evaluate assertion%s%s",pcVar4,
            _type->message);
    }
    pAVar2 = _type->next;
    free((_type->patch).rpnExpression);
    free(_type->message);
    free(_type);
    _type = pAVar2;
  } while( true );
}

Assistant:

void patch_CheckAssertions(struct Assertion *assert)
{
	verbosePrint("Checking assertions...\n");
	initRPNStack();

	while (assert) {
		int32_t value = computeRPNExpr(&assert->patch,
			(struct Symbol const * const *)assert->fileSymbols);
		enum AssertionType type = (enum AssertionType)assert->patch.type;

		if (!isError && !value) {
			switch (type) {
			case ASSERT_FATAL:
				fatal(assert->patch.src, assert->patch.lineNo, "%s",
				      assert->message[0] ? assert->message
							 : "assert failure");
			case ASSERT_ERROR:
				error(assert->patch.src, assert->patch.lineNo, "%s",
				      assert->message[0] ? assert->message
							 : "assert failure");
				break;
			case ASSERT_WARN:
				warning(assert->patch.src, assert->patch.lineNo, "%s",
					assert->message[0] ? assert->message
							   : "assert failure");
				break;
			}
		} else if (isError && type == ASSERT_FATAL) {
			fatal(assert->patch.src, assert->patch.lineNo,
			      "couldn't evaluate assertion%s%s",
			      assert->message[0] ? ": " : "",
			      assert->message);
		}
		struct Assertion *next = assert->next;

		free(assert->patch.rpnExpression);
		free(assert->message);
		free(assert);
		assert = next;
	}

	freeRPNStack();
}